

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::VerifyLinkItemColons(cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  string_view str;
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  long lVar4;
  cmLocalGenerator *pcVar5;
  cmake *this_00;
  PolicyID id;
  bool bVar6;
  string_view prefix;
  undefined1 local_2d8 [24];
  cmListFileBacktrace backtrace;
  cmAlphaNum local_288;
  string local_258;
  cmAlphaNum local_238;
  cmAlphaNum local_208;
  string local_1d8;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  string local_158;
  undefined4 local_134;
  cmAlphaNum local_130;
  string local_100;
  cmAlphaNum local_e0;
  string local_b0;
  undefined1 local_80 [8];
  string e;
  MessageType messageType;
  cmLinkItem *item_local;
  LinkItemRole role_local;
  cmGeneratorTarget *this_local;
  
  bVar6 = true;
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    prefix = (string_view)::cm::operator____s("<LINK_GROUP:",0xc);
    bVar1 = cmHasPrefix(str,prefix);
    bVar6 = true;
    if (!bVar1) {
      psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
      lVar4 = std::__cxx11::string::find((char *)psVar3,0xc55158);
      bVar6 = lVar4 == -1;
    }
  }
  if (bVar6) {
    this_local._7_1_ = true;
  }
  else {
    e.field_2._12_4_ = 2;
    std::__cxx11::string::string((string *)local_80);
    pcVar5 = GetLocalGenerator(this);
    PVar2 = cmLocalGenerator::GetPolicyStatus(pcVar5,CMP0028);
    if (PVar2 == OLD) {
      this_local._7_1_ = true;
      local_134 = 1;
    }
    else {
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_100,(cmPolicies *)0x1c,id);
        cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
        cmAlphaNum::cmAlphaNum(&local_130,"\n");
        cmStrCat<>(&local_b0,&local_e0,&local_130);
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_100);
        e.field_2._12_4_ = 0;
      }
      if (role == Implementation) {
        cmAlphaNum::cmAlphaNum(&local_188,(string *)local_80);
        cmAlphaNum::cmAlphaNum(&local_1b8,"Target \"");
        psVar3 = GetName_abi_cxx11_(this);
        cmStrCat<std::__cxx11::string,char[11]>
                  (&local_158,&local_188,&local_1b8,psVar3,(char (*) [11])"\" links to");
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_208,(string *)local_80);
        cmAlphaNum::cmAlphaNum(&local_238,"The link interface of target \"");
        psVar3 = GetName_abi_cxx11_(this);
        cmStrCat<std::__cxx11::string,char[11]>
                  (&local_1d8,&local_208,&local_238,psVar3,(char (*) [11])"\" contains");
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      cmAlphaNum::cmAlphaNum(&local_288,(string *)local_80);
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)
                 &backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,":\n  ");
      psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
      cmStrCat<std::__cxx11::string,char[2],char[32],std::basic_string_view<char,std::char_traits<char>>>
                (&local_258,&local_288,
                 (cmAlphaNum *)
                 &backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,psVar3,(char (*) [2])0xc47774,
                 (char (*) [32])"but the target was not found.  ",
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 (anonymous_namespace)::missingTargetPossibleReasons);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      cmListFileBacktrace::cmListFileBacktrace
                ((cmListFileBacktrace *)(local_2d8 + 0x10),&item->Backtrace);
      bVar6 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_2d8 + 0x10))
      ;
      if (bVar6) {
        GetBacktrace((cmGeneratorTarget *)local_2d8);
        cmListFileBacktrace::operator=
                  ((cmListFileBacktrace *)(local_2d8 + 0x10),(cmListFileBacktrace *)local_2d8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2d8);
      }
      pcVar5 = GetLocalGenerator(this);
      this_00 = cmLocalGenerator::GetCMakeInstance(pcVar5);
      cmake::IssueMessage(this_00,e.field_2._12_4_,(string *)local_80,
                          (cmListFileBacktrace *)(local_2d8 + 0x10));
      this_local._7_1_ = false;
      local_134 = 1;
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_2d8 + 0x10));
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemColons(LinkItemRole role,
                                             cmLinkItem const& item) const
{
  if (item.Target || cmHasPrefix(item.AsStr(), "<LINK_GROUP:"_s) ||
      item.AsStr().find("::") == std::string::npos) {
    return true;
  }
  MessageType messageType = MessageType::FATAL_ERROR;
  std::string e;
  switch (this->GetLocalGenerator()->GetPolicyStatus(cmPolicies::CMP0028)) {
    case cmPolicies::WARN: {
      e = cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0028), "\n");
      messageType = MessageType::AUTHOR_WARNING;
    } break;
    case cmPolicies::OLD:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Issue the fatal message.
      break;
  }

  if (role == LinkItemRole::Implementation) {
    e = cmStrCat(e, "Target \"", this->GetName(), "\" links to");
  } else {
    e = cmStrCat(e, "The link interface of target \"", this->GetName(),
                 "\" contains");
  }
  e =
    cmStrCat(e, ":\n  ", item.AsStr(), "\n", "but the target was not found.  ",
             missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(messageType, e,
                                                              backtrace);
  return false;
}